

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

string * inja::Parser::load_file(string *__return_storage_ptr__,path *filename)

{
  undefined8 uVar1;
  FileError *this;
  string sStack_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  ifstream file;
  byte abStack_208 [200];
  undefined8 auStack_140 [36];
  
  ::std::ifstream::ifstream(&file);
  std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
            (&file,filename,_S_in);
  if ((abStack_208[*(long *)(_file + -0x18)] & 5) == 0) {
    uVar1 = *(undefined8 *)((long)auStack_140 + *(long *)(_file + -0x18));
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)__return_storage_ptr__,uVar1,0xffffffffffffffff,0,0xffffffff);
    ::std::ifstream::~ifstream(&file);
    return __return_storage_ptr__;
  }
  this = (FileError *)__cxa_allocate_exception(0x60);
  std::filesystem::__cxx11::path::string(&sStack_288,filename);
  ::std::operator+(&local_268,"failed accessing file at \'",&sStack_288);
  ::std::operator+(&local_248,&local_268,"\'");
  FileError::FileError(this,&local_248);
  __cxa_throw(this,&FileError::typeinfo,InjaError::~InjaError);
}

Assistant:

static std::string load_file(const std::filesystem::path& filename) {
    std::ifstream file;
    file.open(filename);
    if (file.fail()) {
      INJA_THROW(FileError("failed accessing file at '" + filename.string() + "'"));
    }
    std::string text((std::istreambuf_iterator<char>(file)), std::istreambuf_iterator<char>());
    return text;
  }